

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O0

doublereal sdot_(integer *n,real *sx,integer *incx,real *sy,integer *incy)

{
  real ret_val;
  integer i__1;
  integer *incy_local;
  real *sy_local;
  integer *incx_local;
  real *sx_local;
  integer *n_local;
  
  sdot_::stemp = 0.0;
  if (*n < 1) {
    sdot_::stemp = 0.0;
    return 0.0;
  }
  if ((*incx != 1) || (*incy != 1)) {
    sdot_::ix = 1;
    sdot_::iy = 1;
    if (*incx < 0) {
      sdot_::ix = (1 - *n) * *incx + 1;
    }
    if (*incy < 0) {
      sdot_::iy = (1 - *n) * *incy + 1;
    }
    for (sdot_::i__ = 1; sdot_::i__ <= *n; sdot_::i__ = sdot_::i__ + 1) {
      sdot_::stemp = sx[(long)sdot_::ix + -1] * sy[(long)sdot_::iy + -1] + sdot_::stemp;
      sdot_::ix = *incx + sdot_::ix;
      sdot_::iy = *incy + sdot_::iy;
    }
    return (double)sdot_::stemp;
  }
  sdot_::m = *n % 5;
  if (sdot_::m != 0) {
    for (sdot_::i__ = 1; sdot_::i__ <= sdot_::m; sdot_::i__ = sdot_::i__ + 1) {
      sdot_::stemp = sx[(long)sdot_::i__ + -1] * sy[(long)sdot_::i__ + -1] + sdot_::stemp;
    }
    if (*n < 5) goto LAB_0011bfcc;
  }
  sdot_::mp1 = sdot_::m + 1;
  for (sdot_::i__ = sdot_::mp1; sdot_::i__ <= *n; sdot_::i__ = sdot_::i__ + 5) {
    sdot_::stemp = sx[(long)(sdot_::i__ + 4) + -1] * sy[(long)(sdot_::i__ + 4) + -1] +
                   sx[(long)(sdot_::i__ + 3) + -1] * sy[(long)(sdot_::i__ + 3) + -1] +
                   sx[(long)(sdot_::i__ + 2) + -1] * sy[(long)(sdot_::i__ + 2) + -1] +
                   sx[(long)(sdot_::i__ + 1) + -1] * sy[(long)(sdot_::i__ + 1) + -1] +
                   sx[(long)sdot_::i__ + -1] * sy[(long)sdot_::i__ + -1] + sdot_::stemp;
  }
LAB_0011bfcc:
  return (double)sdot_::stemp;
}

Assistant:

doublereal sdot_(integer *n, real *sx, integer *incx, real *sy, integer *incy)
{
    /* System generated locals */
    integer i__1;
    real ret_val;

    /* Local variables */
    static integer i__, m, ix, iy, mp1;
    static real stemp;


/*
       forms the dot product of two vectors.
       uses unrolled loops for increments equal to one.
       jack dongarra, linpack, 3/11/78.
       modified 12/3/93, array(1) declarations changed to array(*)
*/


    /* Parameter adjustments */
    --sy;
    --sx;

    /* Function Body */
    stemp = 0.f;
    ret_val = 0.f;
    if (*n <= 0) {
	return ret_val;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*
          code for unequal increments or equal increments
            not equal to 1
*/

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	stemp += sx[ix] * sy[iy];
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    ret_val = stemp;
    return ret_val;

/*
          code for both increments equal to 1


          clean-up loop
*/

L20:
    m = *n % 5;
    if (m == 0) {
	goto L40;
    }
    i__1 = m;
    for (i__ = 1; i__ <= i__1; ++i__) {
	stemp += sx[i__] * sy[i__];
/* L30: */
    }
    if (*n < 5) {
	goto L60;
    }
L40:
    mp1 = m + 1;
    i__1 = *n;
    for (i__ = mp1; i__ <= i__1; i__ += 5) {
	stemp = stemp + sx[i__] * sy[i__] + sx[i__ + 1] * sy[i__ + 1] + sx[
		i__ + 2] * sy[i__ + 2] + sx[i__ + 3] * sy[i__ + 3] + sx[i__ +
		4] * sy[i__ + 4];
/* L50: */
    }
L60:
    ret_val = stemp;
    return ret_val;
}